

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O2

ObjectPtr __thiscall ICM::DefFunc::Lists::Mul::func(Mul *this,DataList *list)

{
  undefined8 *puVar1;
  DataObject<(ICM::DefaultType)17> *this_00;
  long in_RDX;
  long lVar2;
  bool bVar3;
  vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> nl;
  _Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_> local_38;
  
  puVar1 = *(undefined8 **)(**(long **)(in_RDX + 8) + 8);
  nl.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nl.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nl.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar2 = **(long **)((*(long **)(in_RDX + 8))[1] + 8);
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    std::vector<ICM::Object*,std::allocator<ICM::Object*>>::
    insert<__gnu_cxx::__normal_iterator<ICM::Object**,std::vector<ICM::Object*,std::allocator<ICM::Object*>>>,void>
              ((vector<ICM::Object*,std::allocator<ICM::Object*>> *)&nl,
               (const_iterator)
               nl.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Object **)*puVar1,(Object **)puVar1[1]);
  }
  this_00 = (DataObject<(ICM::DefaultType)17> *)operator_new(0x10);
  std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::vector
            ((vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> *)&local_38,&nl);
  Objects::DataObject<(ICM::DefaultType)17>::DataObject(this_00,(T *)&local_38);
  (this->super_FI)._vptr_FuncInitObject = (_func_int **)this_00;
  std::_Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>::~_Vector_base(&local_38);
  std::_Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>::~_Vector_base
            (&nl.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					auto &l = *list[0]->get<T_List>();
					vector<Object*> nl;
					for (size_t i : Range<size_t>(0, (size_t)list[1]->dat<T_Number>()/*->getNum()*/)) {
						nl.insert(nl.end(), l.begin(), l.end());
					}
					return ObjectPtr(new List(ListType(nl)));
				}